

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tclpkcs11.c
# Opt level: O0

int tclpkcs11_list_certs(ClientData cd,Tcl_Interp *interp,int objc,Tcl_Obj **objv)

{
  ProcErrorProc *pPVar1;
  CK_ULONG CVar2;
  _func_int_Tcl_Interp_ptr_Tcl_Obj_ptr_Tcl_Obj_ptr *p_Var3;
  Tcl_Interp *pTVar4;
  int iVar5;
  Tcl_Obj *pTVar6;
  CK_RV CVar7;
  char *pcVar8;
  Tcl_Obj *pTVar9;
  long local_138;
  CK_RV chk_rv;
  CK_OBJECT_CLASS *objectclass;
  CK_ULONG curr_attr_idx;
  CK_ATTRIBUTE *curr_attr;
  CK_ATTRIBUTE template [4];
  long local_b0;
  CK_ULONG ulObjectCount;
  CK_OBJECT_HANDLE hObject;
  CK_SLOT_ID slotid;
  int type_cert;
  int tcl_rv;
  Tcl_Obj *parse_cert_cmd;
  Tcl_Obj *curr_item_list;
  Tcl_Obj *ret_list;
  Tcl_Obj *obj_id;
  Tcl_Obj *obj_cert;
  Tcl_Obj *obj_label;
  long slotid_long;
  Tcl_Obj *tcl_slotid;
  Tcl_Obj *tcl_handle;
  Tcl_HashEntry *tcl_handle_entry;
  tclpkcs11_handle *handle;
  tclpkcs11_interpdata *interpdata;
  Tcl_Obj **objv_local;
  Tcl_Interp *pTStack_20;
  int objc_local;
  Tcl_Interp *interp_local;
  ClientData cd_local;
  
  interpdata = (tclpkcs11_interpdata *)objv;
  objv_local._4_4_ = objc;
  pTStack_20 = interp;
  interp_local = (Tcl_Interp *)cd;
  memset(&curr_attr,0,0x60);
  pTVar4 = pTStack_20;
  template[0].ulValueLen = 3;
  template[1].ulValueLen = 0x102;
  template[2].ulValueLen = 0x11;
  if (interp_local == (Tcl_Interp *)0x0) {
    pPVar1 = tclStubsPtr->tcl_SetObjResult;
    pTVar6 = (*tclStubsPtr->tcl_NewStringObj)("invalid clientdata",-1);
    (*pPVar1)((Tcl_Interp_conflict *)pTVar4,pTVar6);
    cd_local._4_4_ = 1;
  }
  else if (objv_local._4_4_ == 3) {
    tcl_slotid = (Tcl_Obj *)(interpdata->handles).staticBuckets[0];
    slotid_long = (long)(interpdata->handles).staticBuckets[1];
    handle = (tclpkcs11_handle *)interp_local;
    tcl_handle = (Tcl_Obj *)(**(code **)&interp_local[2].errorLineDontUse)(interp_local,tcl_slotid);
    pTVar4 = pTStack_20;
    if (tcl_handle == (Tcl_Obj *)0x0) {
      pPVar1 = tclStubsPtr->tcl_SetObjResult;
      pTVar6 = (*tclStubsPtr->tcl_NewStringObj)("invalid handle",-1);
      (*pPVar1)((Tcl_Interp_conflict *)pTVar4,pTVar6);
      cd_local._4_4_ = 1;
    }
    else {
      tcl_handle_entry = (Tcl_HashEntry *)tcl_handle->typePtr;
      if ((Tcl_ObjType *)tcl_handle_entry == (Tcl_ObjType *)0x0) {
        pPVar1 = tclStubsPtr->tcl_SetObjResult;
        pTVar6 = (*tclStubsPtr->tcl_NewStringObj)("invalid handle",-1);
        (*pPVar1)((Tcl_Interp_conflict *)pTVar4,pTVar6);
        cd_local._4_4_ = 1;
      }
      else {
        slotid._4_4_ = (*tclStubsPtr->tcl_GetLongFromObj)
                                 ((Tcl_Interp_conflict *)pTStack_20,(Tcl_Obj *)slotid_long,
                                  (long *)&obj_label);
        cd_local._4_4_ = slotid._4_4_;
        if (slotid._4_4_ == 0) {
          hObject = (CK_OBJECT_HANDLE)obj_label;
          iVar5 = tclpkcs11_start_session
                            ((tclpkcs11_handle *)tcl_handle_entry,(CK_SLOT_ID)obj_label);
          pTVar4 = pTStack_20;
          if ((long)iVar5 == 0) {
            CVar7 = (**(code **)&tcl_handle_entry->tablePtr[2].numBuckets)
                              ((tcl_handle_entry->key).oneWordValue,0);
            pTVar4 = pTStack_20;
            if (CVar7 == 0) {
              curr_item_list = (*tclStubsPtr->tcl_NewObj)();
              while( true ) {
                slotid._0_4_ = 0;
                CVar7 = (**(code **)&tcl_handle_entry->tablePtr[2].rebuildSize)
                                  ((tcl_handle_entry->key).oneWordValue,&ulObjectCount,1,&local_b0);
                pTVar4 = pTStack_20;
                if (CVar7 != 0) break;
                if (local_b0 == 0) {
                  (**(code **)&tcl_handle_entry->tablePtr[2].mask)
                            ((tcl_handle_entry->key).oneWordValue);
                  (*tclStubsPtr->tcl_SetObjResult)((Tcl_Interp_conflict *)pTStack_20,curr_item_list)
                  ;
                  return 0;
                }
                if (local_b0 != 1) {
                  pPVar1 = tclStubsPtr->tcl_SetObjResult;
                  pTVar6 = (*tclStubsPtr->tcl_NewStringObj)
                                     ("FindObjects() returned a weird number of objects.",-1);
                  (*pPVar1)((Tcl_Interp_conflict *)pTVar4,pTVar6);
                  (**(code **)&tcl_handle_entry->tablePtr[2].mask)
                            ((tcl_handle_entry->key).oneWordValue);
                  return 1;
                }
                for (objectclass = (CK_OBJECT_CLASS *)0x0; objectclass < (CK_OBJECT_CLASS *)0x4;
                    objectclass = (CK_OBJECT_CLASS *)((long)objectclass + 1)) {
                  if (template[(long)objectclass].type != 0) {
                    (*tclStubsPtr->tcl_Free)((char *)template[(long)objectclass].type);
                  }
                  template[(long)objectclass].type = 0;
                  template[(long)objectclass].pValue = (CK_VOID_PTR)0x0;
                }
                local_138 = (*(code *)tcl_handle_entry->tablePtr[2].staticBuckets[2])
                                      ((tcl_handle_entry->key).oneWordValue,ulObjectCount,&curr_attr
                                       ,4);
                if (((local_138 == 0x12) || (local_138 == 0x11)) || (local_138 == 0x150)) {
                  local_138 = 0;
                }
                if (local_138 == 0) {
                  for (objectclass = (CK_OBJECT_CLASS *)0x0; objectclass < (CK_OBJECT_CLASS *)0x4;
                      objectclass = (CK_OBJECT_CLASS *)((long)objectclass + 1)) {
                    if (template[(long)objectclass].pValue != (CK_VOID_PTR)0xffffffffffffffff) {
                      pcVar8 = (*tclStubsPtr->tcl_Alloc)((uint)template[(long)objectclass].pValue);
                      template[(long)objectclass].type = (CK_ATTRIBUTE_TYPE)pcVar8;
                    }
                  }
                  CVar7 = (*(code *)tcl_handle_entry->tablePtr[2].staticBuckets[2])
                                    ((tcl_handle_entry->key).oneWordValue,ulObjectCount,&curr_attr,4
                                    );
                  if (((CVar7 != 0) && (CVar7 != 0x11)) && ((CVar7 != 0x12 && (CVar7 != 0x150)))) {
                    for (objectclass = (CK_OBJECT_CLASS *)0x0; pTVar4 = pTStack_20,
                        objectclass < (CK_OBJECT_CLASS *)0x4;
                        objectclass = (CK_OBJECT_CLASS *)((long)objectclass + 1)) {
                      if (template[(long)objectclass].type != 0) {
                        (*tclStubsPtr->tcl_Free)((char *)template[(long)objectclass].type);
                      }
                    }
                    pPVar1 = tclStubsPtr->tcl_SetObjResult;
                    pTVar6 = tclpkcs11_pkcs11_error(CVar7);
                    (*pPVar1)((Tcl_Interp_conflict *)pTVar4,pTVar6);
                    (**(code **)&tcl_handle_entry->tablePtr[2].mask)
                              ((tcl_handle_entry->key).oneWordValue);
                    return 1;
                  }
                  obj_cert = (Tcl_Obj *)0x0;
                  ret_list = (Tcl_Obj *)0x0;
                  obj_id = (Tcl_Obj *)0x0;
                  chk_rv = 0;
                  for (objectclass = (CK_OBJECT_CLASS *)0x0; objectclass < (CK_OBJECT_CLASS *)0x4;
                      objectclass = (CK_OBJECT_CLASS *)((long)objectclass + 1)) {
                    if (template[(long)objectclass].type != 0) {
                      CVar2 = template[(long)objectclass + -1].ulValueLen;
                      if (CVar2 == 0) {
                        chk_rv = template[(long)objectclass].type;
                        if (*(long *)chk_rv != 1) goto LAB_001053b2;
                        slotid._0_4_ = 1;
                      }
                      else if (CVar2 == 3) {
                        obj_cert = (*tclStubsPtr->tcl_NewStringObj)
                                             ((char *)template[(long)objectclass].type,
                                              (int)template[(long)objectclass].pValue);
                      }
                      else if (CVar2 == 0x11) {
                        if (chk_rv != 0) {
                          obj_id = (*tclStubsPtr->tcl_NewByteArrayObj)
                                             ((uchar *)template[(long)objectclass].type,
                                              (int)template[(long)objectclass].pValue);
                        }
                      }
                      else if (CVar2 == 0x102) {
                        ret_list = tclpkcs11_bytearray_to_string
                                             ((uchar *)template[(long)objectclass].type,
                                              (unsigned_long)template[(long)objectclass].pValue);
                      }
                      (*tclStubsPtr->tcl_Free)((char *)template[(long)objectclass].type);
                      template[(long)objectclass].type = 0;
                    }
LAB_001053b2:
                  }
                  if ((((int)slotid != 0) && (obj_cert != (Tcl_Obj *)0x0)) &&
                     ((ret_list != (Tcl_Obj *)0x0 && (obj_id != (Tcl_Obj *)0x0)))) {
                    pTVar6 = (*tclStubsPtr->tcl_NewObj)();
                    pTVar4 = pTStack_20;
                    p_Var3 = tclStubsPtr->tcl_ListObjAppendElement;
                    parse_cert_cmd = pTVar6;
                    pTVar9 = (*tclStubsPtr->tcl_NewStringObj)("pkcs11_handle",-1);
                    (*p_Var3)((Tcl_Interp_conflict *)pTVar4,pTVar6,pTVar9);
                    (*tclStubsPtr->tcl_ListObjAppendElement)
                              ((Tcl_Interp_conflict *)pTStack_20,parse_cert_cmd,tcl_slotid);
                    pTVar4 = pTStack_20;
                    pTVar6 = parse_cert_cmd;
                    p_Var3 = tclStubsPtr->tcl_ListObjAppendElement;
                    pTVar9 = (*tclStubsPtr->tcl_NewStringObj)("pkcs11_slotid",-1);
                    (*p_Var3)((Tcl_Interp_conflict *)pTVar4,pTVar6,pTVar9);
                    (*tclStubsPtr->tcl_ListObjAppendElement)
                              ((Tcl_Interp_conflict *)pTStack_20,parse_cert_cmd,
                               (Tcl_Obj *)slotid_long);
                    pTVar4 = pTStack_20;
                    pTVar6 = parse_cert_cmd;
                    p_Var3 = tclStubsPtr->tcl_ListObjAppendElement;
                    pTVar9 = (*tclStubsPtr->tcl_NewStringObj)("pkcs11_id",-1);
                    (*p_Var3)((Tcl_Interp_conflict *)pTVar4,pTVar6,pTVar9);
                    (*tclStubsPtr->tcl_ListObjAppendElement)
                              ((Tcl_Interp_conflict *)pTStack_20,parse_cert_cmd,ret_list);
                    pTVar4 = pTStack_20;
                    pTVar6 = parse_cert_cmd;
                    p_Var3 = tclStubsPtr->tcl_ListObjAppendElement;
                    pTVar9 = (*tclStubsPtr->tcl_NewStringObj)("pkcs11_label",-1);
                    (*p_Var3)((Tcl_Interp_conflict *)pTVar4,pTVar6,pTVar9);
                    (*tclStubsPtr->tcl_ListObjAppendElement)
                              ((Tcl_Interp_conflict *)pTStack_20,parse_cert_cmd,obj_cert);
                    pTVar6 = (*tclStubsPtr->tcl_NewObj)();
                    pTVar4 = pTStack_20;
                    p_Var3 = tclStubsPtr->tcl_ListObjAppendElement;
                    _type_cert = pTVar6;
                    pTVar9 = (*tclStubsPtr->tcl_NewStringObj)("::pki::x509::parse_cert",-1);
                    (*p_Var3)((Tcl_Interp_conflict *)pTVar4,pTVar6,pTVar9);
                    (*tclStubsPtr->tcl_ListObjAppendElement)
                              ((Tcl_Interp_conflict *)pTStack_20,_type_cert,obj_id);
                    slotid._4_4_ = (*tclStubsPtr->tcl_EvalObjEx)
                                             ((Tcl_Interp_conflict *)pTStack_20,_type_cert,0);
                    pTVar4 = pTStack_20;
                    pTVar6 = parse_cert_cmd;
                    if (slotid._4_4_ == 0) {
                      p_Var3 = tclStubsPtr->tcl_ListObjAppendList;
                      pTVar9 = (*tclStubsPtr->tcl_GetObjResult)((Tcl_Interp_conflict *)pTStack_20);
                      (*p_Var3)((Tcl_Interp_conflict *)pTVar4,pTVar6,pTVar9);
                      pTVar4 = pTStack_20;
                      pTVar6 = parse_cert_cmd;
                      p_Var3 = tclStubsPtr->tcl_ListObjAppendElement;
                      pTVar9 = (*tclStubsPtr->tcl_NewStringObj)("type",-1);
                      (*p_Var3)((Tcl_Interp_conflict *)pTVar4,pTVar6,pTVar9);
                      pTVar4 = pTStack_20;
                      pTVar6 = parse_cert_cmd;
                      p_Var3 = tclStubsPtr->tcl_ListObjAppendElement;
                      pTVar9 = (*tclStubsPtr->tcl_NewStringObj)("pkcs11",-1);
                      (*p_Var3)((Tcl_Interp_conflict *)pTVar4,pTVar6,pTVar9);
                      (*tclStubsPtr->tcl_ListObjAppendElement)
                                ((Tcl_Interp_conflict *)pTStack_20,curr_item_list,parse_cert_cmd);
                    }
                  }
                }
              }
              pPVar1 = tclStubsPtr->tcl_SetObjResult;
              pTVar6 = tclpkcs11_pkcs11_error(CVar7);
              (*pPVar1)((Tcl_Interp_conflict *)pTVar4,pTVar6);
              (**(code **)&tcl_handle_entry->tablePtr[2].mask)((tcl_handle_entry->key).oneWordValue)
              ;
              cd_local._4_4_ = 1;
            }
            else {
              pPVar1 = tclStubsPtr->tcl_SetObjResult;
              pTVar6 = tclpkcs11_pkcs11_error(CVar7);
              (*pPVar1)((Tcl_Interp_conflict *)pTVar4,pTVar6);
              cd_local._4_4_ = 1;
            }
          }
          else {
            pPVar1 = tclStubsPtr->tcl_SetObjResult;
            pTVar6 = tclpkcs11_pkcs11_error((long)iVar5);
            (*pPVar1)((Tcl_Interp_conflict *)pTVar4,pTVar6);
            cd_local._4_4_ = 1;
          }
        }
      }
    }
  }
  else {
    pPVar1 = tclStubsPtr->tcl_SetObjResult;
    pTVar6 = (*tclStubsPtr->tcl_NewStringObj)
                       ("wrong # args: should be \"pki::pkcs11::listcerts handle slot\"",-1);
    (*pPVar1)((Tcl_Interp_conflict *)pTVar4,pTVar6);
    cd_local._4_4_ = 1;
  }
  return cd_local._4_4_;
}

Assistant:

MODULE_SCOPE int tclpkcs11_list_certs(ClientData cd, Tcl_Interp *interp, int objc, Tcl_Obj *CONST objv[]) {
  struct tclpkcs11_interpdata *interpdata;
  struct tclpkcs11_handle *handle;
  Tcl_HashEntry *tcl_handle_entry;
  Tcl_Obj *tcl_handle, *tcl_slotid;
  long slotid_long;
  Tcl_Obj *obj_label, *obj_cert, *obj_id;
  Tcl_Obj *ret_list, *curr_item_list;
  Tcl_Obj *parse_cert_cmd;
  int tcl_rv;
  /*LISSI*/
  int type_cert;

  CK_SLOT_ID slotid;
  CK_OBJECT_HANDLE hObject;
  CK_ULONG ulObjectCount;
  CK_ATTRIBUTE template[] = {
    {CKA_CLASS, NULL, 0},
    {CKA_LABEL, NULL, 0},
    {CKA_ID, NULL, 0},
    {CKA_VALUE, NULL, 0}
  }, *curr_attr;
  CK_ULONG curr_attr_idx;
  CK_OBJECT_CLASS *objectclass;
  CK_RV chk_rv;

  if (!cd) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("invalid clientdata", -1));

    return(TCL_ERROR);
  }

  if (objc != 3) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("wrong # args: should be \"pki::pkcs11::listcerts handle slot\"", -1));

    return(TCL_ERROR);
  }

  tcl_handle = objv[1];
  tcl_slotid = objv[2];

  interpdata = (struct tclpkcs11_interpdata *) cd;

  tcl_handle_entry = Tcl_FindHashEntry(&interpdata->handles, (const char *) tcl_handle);
  if (!tcl_handle_entry) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("invalid handle", -1));

    return(TCL_ERROR);
  }

  handle = (struct tclpkcs11_handle *) Tcl_GetHashValue(tcl_handle_entry);
  if (!handle) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("invalid handle", -1));

    return(TCL_ERROR);
  }

  tcl_rv = Tcl_GetLongFromObj(interp, tcl_slotid, &slotid_long);
  if (tcl_rv != TCL_OK) {
    return(tcl_rv);
  }

  slotid = slotid_long;

  chk_rv = tclpkcs11_start_session(handle, slotid);
  if (chk_rv != CKR_OK) {
    Tcl_SetObjResult(interp, tclpkcs11_pkcs11_error(chk_rv));

    return(TCL_ERROR);
  }

  chk_rv = handle->pkcs11->C_FindObjectsInit(handle->session, NULL, 0);
  if (chk_rv != CKR_OK) {
    Tcl_SetObjResult(interp, tclpkcs11_pkcs11_error(chk_rv));

    return(TCL_ERROR);
  }

  ret_list = Tcl_NewObj();
  while (1) {
    /*LISSI*/
    type_cert = 0;	

    chk_rv = handle->pkcs11->C_FindObjects(handle->session, &hObject, 1, &ulObjectCount);
    if (chk_rv != CKR_OK) {
      Tcl_SetObjResult(interp, tclpkcs11_pkcs11_error(chk_rv));

      handle->pkcs11->C_FindObjectsFinal(handle->session);

      return(TCL_ERROR);
    }

    if (ulObjectCount == 0) {
      break;
    }

    if (ulObjectCount != 1) {
      Tcl_SetObjResult(interp, Tcl_NewStringObj("FindObjects() returned a weird number of objects.", -1));

      handle->pkcs11->C_FindObjectsFinal(handle->session);

      return(TCL_ERROR);
    }

    for (curr_attr_idx = 0; curr_attr_idx < (sizeof(template) / sizeof(template[0])); curr_attr_idx++) {
      curr_attr = &template[curr_attr_idx];
      if (curr_attr->pValue) {
        ckfree(curr_attr->pValue);
      }

      curr_attr->pValue = NULL;
      curr_attr->ulValueLen = 0;
    }

    /* Determine size of values to allocate */
    chk_rv = handle->pkcs11->C_GetAttributeValue(handle->session, hObject, template, sizeof(template) / sizeof(template[0]));
    if (chk_rv == CKR_ATTRIBUTE_TYPE_INVALID || chk_rv == CKR_ATTRIBUTE_SENSITIVE || chk_rv == CKR_BUFFER_TOO_SMALL) {
      chk_rv = CKR_OK;
    }

    if (chk_rv != CKR_OK) {
      /* Skip this object if we are not able to process it */
      continue;
    }

    /* Allocate values */
    for (curr_attr_idx = 0; curr_attr_idx < (sizeof(template) / sizeof(template[0])); curr_attr_idx++) {
      curr_attr = &template[curr_attr_idx];

      if (((CK_LONG) curr_attr->ulValueLen) != ((CK_LONG) -1)) {
        curr_attr->pValue = (void *) ckalloc(curr_attr->ulValueLen);
      }
    }

    /* Populate template values */
    chk_rv = handle->pkcs11->C_GetAttributeValue(handle->session, hObject, template, sizeof(template) / sizeof(template[0]));
    if (chk_rv != CKR_OK && chk_rv != CKR_ATTRIBUTE_SENSITIVE && chk_rv != CKR_ATTRIBUTE_TYPE_INVALID && chk_rv != CKR_BUFFER_TOO_SMALL) {
      /* Return an error if we are unable to process this entry due to unexpected errors */
      for (curr_attr_idx = 0; curr_attr_idx < (sizeof(template) / sizeof(template[0])); curr_attr_idx++) {
        curr_attr = &template[curr_attr_idx];
        if (curr_attr->pValue) {
          ckfree(curr_attr->pValue);
        }
      }

      Tcl_SetObjResult(interp, tclpkcs11_pkcs11_error(chk_rv));

      handle->pkcs11->C_FindObjectsFinal(handle->session);

      return(TCL_ERROR);
    }

    /* Extract certificate data */
    obj_label = NULL;
    obj_id = NULL;
    obj_cert = NULL;
    objectclass = NULL;
    for (curr_attr_idx = 0; curr_attr_idx < (sizeof(template) / sizeof(template[0])); curr_attr_idx++) {
      curr_attr = &template[curr_attr_idx];

      if (!curr_attr->pValue) {
        continue;
      }

      switch (curr_attr->type) {
        case CKA_CLASS:
          objectclass = (CK_OBJECT_CLASS *) curr_attr->pValue;

          if (*objectclass != CKO_CERTIFICATE) {
            continue;
          }
          /*LISSI*/
          type_cert = 1;	

          break;
        case CKA_LABEL:
          obj_label = Tcl_NewStringObj(curr_attr->pValue, curr_attr->ulValueLen);
          break;
        case CKA_ID:
          /* Convert the ID into a readable string */
          obj_id = tclpkcs11_bytearray_to_string(curr_attr->pValue, curr_attr->ulValueLen);

          break;
        case CKA_VALUE:
          if (!objectclass) {
            break;
          }

          obj_cert = Tcl_NewByteArrayObj(curr_attr->pValue, curr_attr->ulValueLen);

          break;
      }

      ckfree(curr_attr->pValue);
      curr_attr->pValue = NULL;
    }
    /*LISSI*/
    if (type_cert == 0) {
      continue;
    }

    /* Add this certificate data to return list, if all found */
    if (obj_label == NULL || obj_id == NULL || obj_cert == NULL) {
      continue;
    }

    /* Create the current item list */
    curr_item_list = Tcl_NewObj();
    Tcl_ListObjAppendElement(interp, curr_item_list, Tcl_NewStringObj("pkcs11_handle", -1));
    Tcl_ListObjAppendElement(interp, curr_item_list, tcl_handle);

    Tcl_ListObjAppendElement(interp, curr_item_list, Tcl_NewStringObj("pkcs11_slotid", -1));
    Tcl_ListObjAppendElement(interp, curr_item_list, tcl_slotid);

    Tcl_ListObjAppendElement(interp, curr_item_list, Tcl_NewStringObj("pkcs11_id", -1));
    Tcl_ListObjAppendElement(interp, curr_item_list, obj_id);

    Tcl_ListObjAppendElement(interp, curr_item_list, Tcl_NewStringObj("pkcs11_label", -1));
    Tcl_ListObjAppendElement(interp, curr_item_list, obj_label);

    /* Call "::pki::x509::parse_cert" to parse the cert */
    parse_cert_cmd = Tcl_NewObj();
    Tcl_ListObjAppendElement(interp, parse_cert_cmd, Tcl_NewStringObj("::pki::x509::parse_cert", -1));
    Tcl_ListObjAppendElement(interp, parse_cert_cmd, obj_cert);

    tcl_rv = Tcl_EvalObjEx(interp, parse_cert_cmd, 0);
    if (tcl_rv != TCL_OK) {
      continue;
    }

    /* Add results of [parse_cert] to our return value */
    Tcl_ListObjAppendList(interp, curr_item_list, Tcl_GetObjResult(interp));

    /*
    * Override the "type" so that [array set] returns our new
    * type, but we can still parse through the list and figure
    * out the real subordinate type
    */
    Tcl_ListObjAppendElement(interp, curr_item_list, Tcl_NewStringObj("type", -1));
    Tcl_ListObjAppendElement(interp, curr_item_list, Tcl_NewStringObj("pkcs11", -1));

    /* Add the current item to the return value list */
    Tcl_ListObjAppendElement(interp, ret_list, curr_item_list);
  }

  /* Terminate search */
  handle->pkcs11->C_FindObjectsFinal(handle->session);

  /* Return */
  Tcl_SetObjResult(interp, ret_list);

  return(TCL_OK);
}